

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O0

void touch_file(char *name)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined8 local_1e0;
  uv_buf_t buf;
  uv_fs_t req;
  uv_file file;
  int r;
  char *name_local;
  
  iVar1 = uv_fs_open(0,&buf.len,name,2,0);
  if (iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
            ,0x174,"r >= 0");
    abort();
  }
  uv_fs_req_cleanup(&buf.len);
  auVar3 = uv_buf_init("foo",4);
  buf.base = auVar3._8_8_;
  local_1e0 = auVar3._0_8_;
  iVar2 = uv_fs_write(0,&buf.len,iVar1,&local_1e0,1,0xffffffffffffffff,0);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
            ,0x17a,"r >= 0");
    abort();
  }
  uv_fs_req_cleanup(&buf.len);
  iVar1 = uv_fs_close(0,&buf.len,iVar1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
            ,0x17e,"r == 0");
    abort();
  }
  uv_fs_req_cleanup(&buf.len);
  return;
}

Assistant:

static void touch_file(const char* name, unsigned int size) {
  uv_file file;
  uv_fs_t req;
  uv_buf_t buf;
  int r;
  unsigned int i;

  r = uv_fs_open(NULL, &req, name, O_WRONLY | O_CREAT | O_TRUNC,
                 S_IWUSR | S_IRUSR, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r >= 0);
  file = r;

  buf = uv_buf_init("a", 1);

  /* Inefficient but simple. */
  for (i = 0; i < size; i++) {
    r = uv_fs_write(NULL, &req, file, &buf, 1, i, NULL);
    uv_fs_req_cleanup(&req);
    ASSERT(r >= 0);
  }

  r = uv_fs_close(NULL, &req, file, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r == 0);
}